

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

ResourceVariableMeta __thiscall
dxil_spv::Converter::Impl::get_resource_variable_meta(Impl *this,MDNode *resource)

{
  ushort uVar1;
  MetadataKind MVar2;
  ValueKind VVar3;
  uint uVar4;
  ConstantAsMetadata *this_00;
  Constant *value;
  key_type this_01;
  ConstantExpr *this_02;
  const_iterator cVar5;
  ushort uVar6;
  key_type local_28;
  
  if (resource == (MDNode *)0x0) {
    uVar6 = 0;
  }
  else {
    this_00 = (ConstantAsMetadata *)LLVMBC::MDNode::getOperand(resource,1);
    MVar2 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this_00);
    uVar6 = 0x100;
    if (MVar2 == Constant) {
      value = LLVMBC::ConstantAsMetadata::getValue(this_00);
      while (value != (Constant *)0x0) {
        this_01 = (key_type)LLVMBC::Internal::resolve_proxy(&value->super_Value);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_01);
        if (VVar3 == Global) {
          local_28 = this_01;
          cVar5 = std::
                  _Hashtable<const_LLVMBC::GlobalVariable_*,_const_LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::GlobalVariable_*>,_std::hash<const_LLVMBC::GlobalVariable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find(&(this->llvm_active_global_resource_variables)._M_h,&local_28);
          uVar6 = (ushort)(cVar5.super__Node_iterator_base<const_LLVMBC::GlobalVariable_*,_false>.
                           _M_cur != (__node_type *)0x0) << 8;
          uVar1 = 1;
          goto LAB_00113b91;
        }
        this_02 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_02);
        if (VVar3 != ConstantExpr) break;
        uVar4 = LLVMBC::ConstantExpr::getOpcode(this_02);
        if (uVar4 != 0x70) break;
        value = LLVMBC::ConstantExpr::getOperand(this_02,0);
      }
    }
  }
  uVar1 = 0;
LAB_00113b91:
  return (ResourceVariableMeta)(uVar1 | uVar6);
}

Assistant:

Converter::Impl::ResourceVariableMeta Converter::Impl::get_resource_variable_meta(const llvm::MDNode *resource) const
{
	ResourceVariableMeta meta = {};

	if (!resource)
		return meta;

	if (const auto *variable = llvm::dyn_cast<llvm::ConstantAsMetadata>(resource->getOperand(1)))
	{
		const llvm::Value *val = variable->getValue();
		const auto *global = llvm::dyn_cast<llvm::GlobalVariable>(val);

		// It's possible that the variable is a constexpr bitcast, so resolve those ...
		while (!global && val)
		{
			auto *constexpr_op = llvm::dyn_cast<llvm::ConstantExpr>(val);
			val = nullptr;

			if (constexpr_op && constexpr_op->getOpcode() == llvm::UnaryOperator::BitCast)
			{
				val = constexpr_op->getOperand(0);
				global = llvm::dyn_cast<llvm::GlobalVariable>(val);
			}
		}

		if (global)
		{
			meta.is_lib_variable = true;
			meta.is_active = llvm_active_global_resource_variables.count(global) != 0;
			return meta;
		}
	}

	meta.is_active = true;
	return meta;
}